

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_core_validation.cpp
# Opt level: O0

XrResult GenValidUsageInputsXrCreateInstance(XrInstanceCreateInfo *createInfo,XrInstance *instance)

{
  allocator local_221;
  string local_220 [32];
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_200;
  allocator local_1e1;
  string local_1e0 [39];
  allocator local_1b9;
  string local_1b8 [39];
  allocator local_191;
  string local_190 [32];
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_170;
  allocator local_151;
  string local_150 [39];
  allocator local_129;
  string local_128 [39];
  allocator local_101;
  string local_100 [32];
  undefined4 local_e0;
  allocator local_d9;
  string local_d8 [32];
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_b8;
  allocator local_99;
  string local_98 [55];
  allocator local_61;
  string local_60 [32];
  undefined1 local_40 [8];
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> objects_info;
  XrResult xr_result;
  XrInstance *instance_local;
  XrInstanceCreateInfo *createInfo_local;
  
  objects_info.
  super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = XR_SUCCESS;
  std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
            ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
             local_40);
  if (createInfo == (XrInstanceCreateInfo *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_60,"VUID-xrCreateInstance-createInfo-parameter",&local_61);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_98,"xrCreateInstance",&local_99);
    std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
              (&local_b8,
               (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
               local_40);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_d8,
               "Invalid NULL for XrInstanceCreateInfo \"createInfo\" which is not optional and must be non-NULL"
               ,&local_d9);
    CoreValidLogMessage((GenValidUsageXrInstanceInfo *)0x0,(string *)local_60,
                        VALID_USAGE_DEBUG_SEVERITY_ERROR,(string *)local_98,&local_b8,
                        (string *)local_d8);
    std::__cxx11::string::~string(local_d8);
    std::allocator<char>::~allocator((allocator<char> *)&local_d9);
    std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::~vector
              (&local_b8);
    std::__cxx11::string::~string(local_98);
    std::allocator<char>::~allocator((allocator<char> *)&local_99);
    std::__cxx11::string::~string(local_60);
    std::allocator<char>::~allocator((allocator<char> *)&local_61);
    createInfo_local._4_4_ = XR_ERROR_VALIDATION_FAILURE;
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_100,"xrCreateInstance",&local_101);
    objects_info.
    super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
         ValidateXrStruct((GenValidUsageXrInstanceInfo *)0x0,(string *)local_100,
                          (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                           *)local_40,true,true,createInfo);
    std::__cxx11::string::~string(local_100);
    std::allocator<char>::~allocator((allocator<char> *)&local_101);
    if (objects_info.
        super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ == XR_SUCCESS) {
      if (instance == (XrInstance *)0x0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  (local_1b8,"VUID-xrCreateInstance-instance-parameter",&local_1b9);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_1e0,"xrCreateInstance",&local_1e1);
        std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                  (&local_200,
                   (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
                   local_40);
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  (local_220,
                   "Invalid NULL for XrInstance \"instance\" which is not optional and must be non-NULL"
                   ,&local_221);
        CoreValidLogMessage((GenValidUsageXrInstanceInfo *)0x0,(string *)local_1b8,
                            VALID_USAGE_DEBUG_SEVERITY_ERROR,(string *)local_1e0,&local_200,
                            (string *)local_220);
        std::__cxx11::string::~string(local_220);
        std::allocator<char>::~allocator((allocator<char> *)&local_221);
        std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::~vector
                  (&local_200);
        std::__cxx11::string::~string(local_1e0);
        std::allocator<char>::~allocator((allocator<char> *)&local_1e1);
        std::__cxx11::string::~string(local_1b8);
        std::allocator<char>::~allocator((allocator<char> *)&local_1b9);
        createInfo_local._4_4_ = XR_ERROR_VALIDATION_FAILURE;
      }
      else {
        createInfo_local._4_4_ =
             objects_info.
             super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
      }
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_128,"VUID-xrCreateInstance-createInfo-parameter",&local_129);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_150,"xrCreateInstance",&local_151);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                (&local_170,
                 (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
                 local_40);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_190,"Command xrCreateInstance param createInfo is invalid",&local_191);
      CoreValidLogMessage((GenValidUsageXrInstanceInfo *)0x0,(string *)local_128,
                          VALID_USAGE_DEBUG_SEVERITY_ERROR,(string *)local_150,&local_170,
                          (string *)local_190);
      std::__cxx11::string::~string(local_190);
      std::allocator<char>::~allocator((allocator<char> *)&local_191);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::~vector
                (&local_170);
      std::__cxx11::string::~string(local_150);
      std::allocator<char>::~allocator((allocator<char> *)&local_151);
      std::__cxx11::string::~string(local_128);
      std::allocator<char>::~allocator((allocator<char> *)&local_129);
      createInfo_local._4_4_ =
           objects_info.
           super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
    }
  }
  local_e0 = 1;
  std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::~vector
            ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
             local_40);
  return createInfo_local._4_4_;
}

Assistant:

XrResult GenValidUsageInputsXrCreateInstance(
const XrInstanceCreateInfo* createInfo,
XrInstance* instance) {
    try {
        XrResult xr_result = XR_SUCCESS;
        std::vector<GenValidUsageXrObjectInfo> objects_info;
        // Non-optional pointer/array variable that needs to not be NULL
        if (nullptr == createInfo) {
            CoreValidLogMessage(nullptr, "VUID-xrCreateInstance-createInfo-parameter",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, "xrCreateInstance", objects_info,
                                "Invalid NULL for XrInstanceCreateInfo \"createInfo\" which is not "
                                "optional and must be non-NULL");
            return XR_ERROR_VALIDATION_FAILURE;
        }
        // Validate that the structure XrInstanceCreateInfo is valid
        xr_result = ValidateXrStruct(nullptr, "xrCreateInstance", objects_info,
                                                        true, true, createInfo);
        if (XR_SUCCESS != xr_result) {
            CoreValidLogMessage(nullptr, "VUID-xrCreateInstance-createInfo-parameter",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, "xrCreateInstance",
                                objects_info,
                                "Command xrCreateInstance param createInfo is invalid");
            return xr_result;
        }
        // Non-optional pointer/array variable that needs to not be NULL
        if (nullptr == instance) {
            CoreValidLogMessage(nullptr, "VUID-xrCreateInstance-instance-parameter",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, "xrCreateInstance", objects_info,
                                "Invalid NULL for XrInstance \"instance\" which is not "
                                "optional and must be non-NULL");
            return XR_ERROR_VALIDATION_FAILURE;
        }
        return xr_result;
    } catch (...) {
        return XR_ERROR_VALIDATION_FAILURE;
    }
}